

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::AnyTest_MoveConstructor_Test::~AnyTest_MoveConstructor_Test
          (AnyTest_MoveConstructor_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AnyTest, MoveConstructor) {
  proto2_unittest::TestAny payload;
  payload.set_int32_value(12345);

  google::protobuf::Any src;
  src.PackFrom(payload);

  const char* type_url = src.type_url().data();

  google::protobuf::Any dst(std::move(src));
  EXPECT_EQ(type_url, dst.type_url().data());
  payload.Clear();
  ASSERT_TRUE(dst.UnpackTo(&payload));
  EXPECT_EQ(12345, payload.int32_value());
}